

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_sync_unittest.h
# Opt level: O2

void __thiscall
bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
~CertIssuerSourceSyncTest
          (CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
           *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void SetUp() override {
    ASSERT_TRUE(ReadTestCert("root.pem", &root_));
    ASSERT_TRUE(ReadTestCert("i1_1.pem", &i1_1_));
    ASSERT_TRUE(ReadTestCert("i1_2.pem", &i1_2_));
    ASSERT_TRUE(ReadTestCert("i2.pem", &i2_));
    ASSERT_TRUE(ReadTestCert("i3_1.pem", &i3_1_));
    ASSERT_TRUE(ReadTestCert("i3_2.pem", &i3_2_));
    ASSERT_TRUE(ReadTestCert("c1.pem", &c1_));
    ASSERT_TRUE(ReadTestCert("c2.pem", &c2_));
    ASSERT_TRUE(ReadTestCert("d.pem", &d_));
    ASSERT_TRUE(ReadTestCert("e1.pem", &e1_));
    ASSERT_TRUE(ReadTestCert("e2.pem", &e2_));
  }